

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cc
# Opt level: O2

uchar * SHA224(uchar *d,size_t n,uchar *md)

{
  SHA256_CTX ctx;
  
  BCM_sha224_init(&ctx);
  BCM_sha224_update(&ctx,d,n);
  BCM_sha224_final(md,&ctx);
  OPENSSL_cleanse(&ctx,0x70);
  return md;
}

Assistant:

uint8_t *SHA224(const uint8_t *data, size_t len,
                uint8_t out[SHA224_DIGEST_LENGTH]) {
  SHA256_CTX ctx;
  BCM_sha224_init(&ctx);
  BCM_sha224_update(&ctx, data, len);
  BCM_sha224_final(out, &ctx);
  OPENSSL_cleanse(&ctx, sizeof(ctx));
  return out;
}